

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O2

secp256k1_ecdsa_signature *
cfd::core::ParseSignature(secp256k1_ecdsa_signature *__return_storage_ptr__,ByteData *signature)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  allocator local_49;
  string local_48;
  
  ctx = wally_get_secp_context();
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,signature);
  iVar1 = secp256k1_ecdsa_signature_parse_compact
                    (ctx,__return_storage_ptr__,(uchar *)local_48._M_dataplus._M_p);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
  if (iVar1 == 1) {
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_48,"Could not parse ECDSA signature.",&local_49);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_48);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_ecdsa_signature ParseSignature(const ByteData& signature) {
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature result;
  auto ret = secp256k1_ecdsa_signature_parse_compact(
      ctx, &result, signature.GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Could not parse ECDSA signature.");
  }

  return result;
}